

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_smash_wall(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc_conflict grid_00;
  loc_conflict adj_grid;
  wchar_t i;
  chunk *c_local;
  loc_conflict grid_local;
  
  square_set_feat(c,grid,L'\x01');
  for (adj_grid.x = L'\0'; adj_grid.x < L'\b'; adj_grid.x = adj_grid.x + L'\x01') {
    grid_00 = (loc_conflict)loc_sum((loc)grid,ddgrid_ddd[adj_grid.x]);
    _Var1 = square_in_bounds_fully(c,grid_00);
    if ((_Var1) && (_Var1 = square_isperm(c,grid_00), !_Var1)) {
      _Var1 = square_isfloor(c,grid_00);
      if (_Var1) {
        _Var1 = square_isdecoyed(c,grid_00);
        if (_Var1) {
          square_destroy_decoy(c,grid_00);
        }
      }
      else {
        _Var1 = square_isgranite(c,grid_00);
        if ((((!_Var1) || (uVar2 = Rand_div(4), uVar2 != 0)) &&
            ((_Var1 = square_isquartz(c,grid_00), !_Var1 || (uVar2 = Rand_div(10), uVar2 != 0)))) &&
           ((_Var1 = square_ismagma(c,grid_00), !_Var1 || (uVar2 = Rand_div(0x14), uVar2 != 0)))) {
          square_set_feat(c,grid_00,L'\x01');
        }
      }
    }
  }
  return;
}

Assistant:

void square_smash_wall(struct chunk *c, struct loc grid)
{
	int i;
	square_set_feat(c, grid, FEAT_FLOOR);

	for (i = 0; i < 8; i++) {
		/* Extract adjacent location */
		struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);

		/* Check legality */
		if (!square_in_bounds_fully(c, adj_grid)) continue;

		/* Ignore permanent grids */
		if (square_isperm(c, adj_grid)) continue;

		/* Ignore floors, but destroy decoys */
		if (square_isfloor(c, adj_grid)) {
			if (square_isdecoyed(c, adj_grid)) {
				square_destroy_decoy(c, adj_grid);
			}
			continue;
		}

		/* Give this grid a chance to survive */
		if ((square_isgranite(c, adj_grid) && one_in_(4)) ||
			(square_isquartz(c, adj_grid) && one_in_(10)) ||
			(square_ismagma(c, adj_grid) && one_in_(20))) {
			continue;
		}

		/* Remove it */
		square_set_feat(c, adj_grid, FEAT_FLOOR);
	}
}